

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkItem>
          (cmComputeLinkDepends *this,size_t depender_index,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libs)

{
  cmake *pcVar1;
  size_t this_00;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  TargetType TVar5;
  string *psVar6;
  string *psVar7;
  ulong uVar8;
  pair<int,_bool> pVar9;
  reference pvVar10;
  reference pvVar11;
  reference __x;
  reference puVar12;
  reference puVar13;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *pvVar14;
  reference ppVar15;
  reference pvVar16;
  cmGeneratorTarget **args_1;
  string_view sVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  str;
  string_view sVar18;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_bool>
  pVar19;
  pair<unsigned_long,_bool> pVar20;
  pair<const_unsigned_long,_cmComputeLinkDepends::DependSet> *dependSet_1;
  iterator __end1;
  iterator __begin1;
  map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
  *__range1_1;
  pair<const_unsigned_long,_cmComputeLinkDepends::DependSet> *dependSet;
  iterator __end4_2;
  iterator __begin4_2;
  map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
  *__range4_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_470;
  bool local_462;
  bool local_461;
  unsigned_long local_460;
  unsigned_long index_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  unsigned_long index;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4_1;
  pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *group;
  iterator __end3;
  iterator __begin3;
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range3;
  undefined1 local_3f8 [7];
  bool entryHandled;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indexes;
  char local_3cb;
  byte local_3ca;
  allocator<char> local_3c9;
  string local_3c8;
  char local_3a3;
  byte local_3a2;
  allocator<char> local_3a1;
  string local_3a0;
  string local_380;
  undefined1 local_360 [24];
  string local_348;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_328;
  unsigned_long *local_320;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_318;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_310;
  _Base_ptr local_308;
  string *groupFeature_2;
  pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *g;
  iterator __end4;
  iterator __begin4;
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range4;
  string *currentFeature;
  undefined1 local_2d0 [7];
  bool supportedItem;
  cmLocalGenerator *local_2c0;
  string local_2b8;
  undefined1 local_298 [24];
  string local_280;
  undefined8 local_260;
  string *groupFeature_1;
  string *itemFeature;
  LinkEntry *entry;
  undefined1 local_240;
  LinkEntry *local_238;
  pair<unsigned_long,_bool> ale;
  string local_218;
  string *local_1f8;
  string *groupFeature;
  value_type *depender_1;
  pair<int,_bool> local_1e0;
  _Base_ptr local_1d8;
  bool local_1d0;
  string_view local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1b8;
  string_view local_1a0;
  LinkEntry *local_190;
  size_t dependee_index;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_180;
  bool local_172;
  bool local_171;
  string local_170;
  reference local_150;
  LinkEntry *entry_1;
  bool local_140;
  pair<unsigned_long,_bool> local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_128;
  _Base_ptr local_118;
  char *pcStack_110;
  string_view local_108;
  undefined1 local_f8 [16];
  string local_e8;
  undefined1 local_c8 [8];
  value_type *depender;
  cmLinkItem *item;
  cmLinkItem *l;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> groupItems;
  bool local_69;
  undefined1 local_68 [8];
  pair<unsigned_long,_bool> groupIndex;
  undefined1 local_50 [7];
  bool inGroup;
  map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libs_local;
  size_t depender_index_local;
  cmComputeLinkDepends *this_local;
  
  dependSets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)libs;
  std::
  map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
  ::map((map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
         *)local_50);
  groupIndex._15_1_ = 0;
  local_69 = false;
  std::pair<unsigned_long,_bool>::pair<bool,_true>
            ((pair<unsigned_long,_bool> *)local_68,&cmComputeComponentGraph::INVALID_COMPONENT,
             &local_69);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
  this_00 = dependSets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end0 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                     ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                      dependSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  l = (cmLinkItem *)
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                *)&l);
    if (!bVar2) {
      __end1 = std::
               map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
               ::begin((map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
                        *)local_50);
      dependSet_1 = (pair<const_unsigned_long,_cmComputeLinkDepends::DependSet> *)
                    std::
                    map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
                    ::end((map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
                           *)local_50);
      while( true ) {
        bVar2 = std::operator!=(&__end1,(_Self *)&dependSet_1);
        if (!bVar2) break;
        ppVar15 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>
                  ::operator*(&__end1);
        pvVar16 = std::
                  vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                  ::operator[](&this->InferredDependSets,ppVar15->first);
        std::
        vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>::
        push_back(&pvVar16->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                  ,&ppVar15->second);
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>::
        operator++(&__end1);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
      std::
      map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
      ::~map((map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
              *)local_50);
      return;
    }
    depender = (value_type *)
               __gnu_cxx::
               __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
               ::operator*(&__end0);
    item = (cmLinkItem *)depender;
    psVar6 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)depender);
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    _Var3 = std::operator==(psVar6,psVar7);
    if (!_Var3) {
      cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)depender);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&depender->Target,&cmLinkItem::DEFAULT_abi_cxx11_);
        if ((bVar2) && (depender_index != 0xffffffffffffffff)) {
          local_c8 = (undefined1  [8])
                     std::
                     vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ::operator[](&this->EntryList,depender_index);
          if (((reference)local_c8)->Target != (cmGeneratorTarget *)0x0) {
            bVar2 = cmGeneratorTarget::IsImported(((reference)local_c8)->Target);
            if (bVar2) {
              bVar2 = anon_unknown.dwarf_1a364df::IsFeatureSupported
                                (this->Makefile,&this->LinkLanguage,(string *)&depender->Target);
              if (!bVar2) {
                pcVar1 = this->CMakeInstance;
                psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                                   (*(cmGeneratorTarget **)((long)local_c8 + 0x30));
                args_1 = &depender->Target;
                cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[69],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[21],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[21],std::__cxx11::string_const&,char_const(&)[13]>
                          ((string *)(local_f8 + 0x10),(char (*) [24])"The \'IMPORTED\' target \'",
                           psVar6,(char (*) [69])
                                  "\' uses the generator-expression \'$<LINK_LIBRARY>\' with the feature \'"
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            args_1,(char (*) [93])
                                   "\', which is undefined or unsupported.\nDid you miss to define it by setting variables \"CMAKE_"
                           ,&this->LinkLanguage,(char (*) [21])0x11520dc,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_1,(char (*) [14])"\" and \"CMAKE_",&this->LinkLanguage,
                           (char (*) [21])0x11520dc,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_1,(char (*) [13])"_SUPPORTED\"?");
                cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_f8);
                cmake::IssueMessage(pcVar1,AUTHOR_ERROR,(string *)(local_f8 + 0x10),
                                    (cmListFileBacktrace *)local_f8);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_f8);
                std::__cxx11::string::~string((string *)(local_f8 + 0x10));
              }
            }
          }
        }
        psVar6 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)depender);
        sVar17 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        local_118 = (anonymous_namespace)::LG_BEGIN;
        pcStack_110 = DAT_016a5dd8;
        sVar18._M_str = DAT_016a5dd8;
        sVar18._M_len = (size_t)(anonymous_namespace)::LG_BEGIN;
        local_108 = sVar17;
        bVar2 = cmHasPrefix(sVar17,sVar18);
        if (bVar2) {
          psVar6 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)depender);
          str = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                 )std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
          local_128 = str;
          bVar2 = cmHasSuffix((string_view)str,'>');
          if (bVar2) {
            pVar20 = AddLinkEntry(this,(cmLinkItem *)depender,0xffffffffffffffff);
            entry_1 = (LinkEntry *)pVar20.first;
            local_140 = pVar20.second;
            local_138.first = (unsigned_long)entry_1;
            local_138.second = local_140;
            std::pair<unsigned_long,_bool>::operator=
                      ((pair<unsigned_long,_bool> *)local_68,&local_138);
            if (((byte)groupIndex.first & 1) != 0) {
              local_150 = std::
                          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                          ::operator[](&this->EntryList,(size_type)local_68);
              psVar6 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)depender);
              anon_unknown.dwarf_1a364df::ExtractGroupFeature(&local_170,psVar6);
              std::__cxx11::string::operator=((string *)&local_150->Feature,(string *)&local_170);
              std::__cxx11::string::~string((string *)&local_170);
            }
            groupIndex._15_1_ = 1;
            if (depender_index == 0xffffffffffffffff) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        (&this->OriginalEntries,(value_type_conflict1 *)local_68);
            }
            else {
              pvVar14 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                        std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                                  (&(this->EntryConstraintGraph).
                                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                                   depender_index);
              local_171 = false;
              local_172 = false;
              dependee_index = 0;
              _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&dependee_index);
              std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
              emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace>
                        (pvVar14,(unsigned_long *)local_68,&local_171,&local_172,
                         (cmListFileBacktrace *)&dependee_index);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&dependee_index);
            }
            goto LAB_00b4556a;
          }
        }
        psVar6 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)depender);
        sVar18 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        local_1b8._M_allocated_capacity = (anonymous_namespace)::LG_END._0_8_;
        local_1b8._8_8_ = (anonymous_namespace)::LG_END._8_8_;
        sVar17._M_str = (char *)(anonymous_namespace)::LG_END._8_8_;
        sVar17._M_len = (anonymous_namespace)::LG_END._0_8_;
        local_1a0 = sVar18;
        bVar2 = cmHasPrefix(sVar18,sVar17);
        if (bVar2) {
          psVar6 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)depender);
          sVar18 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
          local_1c8 = sVar18;
          bVar2 = cmHasSuffix(sVar18,'>');
          if (bVar2) {
            local_190 = (LinkEntry *)local_68;
            if (((byte)groupIndex.first & 1) != 0) {
              pVar19 = std::
                       map<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                       ::
                       emplace<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                                 ((map<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                                   *)&this->GroupItems,(unsigned_long *)local_68,
                                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1
                                 );
              local_1d8 = (_Base_ptr)pVar19.first._M_node;
              local_1d0 = pVar19.second;
            }
            groupIndex._15_1_ = 0;
            depender_1._4_4_ = 0xffffffff;
            depender_1._3_1_ = 0;
            pVar9 = std::make_pair<int,bool>
                              ((int *)((long)&depender_1 + 4),(bool *)((long)&depender_1 + 3));
            local_1e0.first = pVar9.first;
            local_1e0.second = pVar9.second;
            std::pair<unsigned_long,bool>::operator=
                      ((pair<unsigned_long,bool> *)local_68,&local_1e0);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
            goto LAB_00b4556a;
          }
        }
        if ((depender_index != 0xffffffffffffffff) && ((groupIndex._15_1_ & 1) != 0)) {
          groupFeature = (string *)
                         std::
                         vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                         ::operator[](&this->EntryList,depender_index);
          pvVar10 = std::
                    vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    ::operator[](&this->EntryList,(size_type)local_68);
          local_1f8 = &pvVar10->Feature;
          if (groupFeature[1].field_2._M_allocated_capacity != 0) {
            bVar2 = cmGeneratorTarget::IsImported
                              ((cmGeneratorTarget *)groupFeature[1].field_2._M_allocated_capacity);
            if (bVar2) {
              bVar2 = anon_unknown.dwarf_1a364df::IsGroupFeatureSupported
                                (this->Makefile,&this->LinkLanguage,local_1f8);
              if (!bVar2) {
                pcVar1 = this->CMakeInstance;
                psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                                   ((cmGeneratorTarget *)
                                    groupFeature[1].field_2._M_allocated_capacity);
                cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>
                          (&local_218,(char (*) [24])"The \'IMPORTED\' target \'",psVar6,
                           (char (*) [67])
                           "\' uses the generator-expression \'$<LINK_GROUP>\' with the feature \'",
                           local_1f8,
                           (char (*) [93])
                           "\', which is undefined or unsupported.\nDid you miss to define it by setting variables \"CMAKE_"
                           ,&this->LinkLanguage,(char (*) [19])0x11523a5,local_1f8,
                           (char (*) [14])"\" and \"CMAKE_",&this->LinkLanguage,
                           (char (*) [19])0x11523a5,local_1f8,(char (*) [13])"_SUPPORTED\"?");
                cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&ale.second);
                cmake::IssueMessage(pcVar1,AUTHOR_ERROR,&local_218,
                                    (cmListFileBacktrace *)&ale.second);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ale.second);
                std::__cxx11::string::~string((string *)&local_218);
              }
            }
          }
        }
        pVar20 = AddLinkEntry(this,(cmLinkItem *)depender,(size_t)local_68);
        entry = (LinkEntry *)pVar20.first;
        local_240 = pVar20.second;
        local_238 = entry;
        ale.first._0_1_ = local_240;
        local_190 = entry;
        itemFeature = (string *)
                      std::
                      vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ::operator[](&this->EntryList,(size_type)entry);
        groupFeature_1 = GetCurrentFeature(this,itemFeature,(string *)&depender->Target);
        if ((((groupIndex._15_1_ & 1) != 0) && (((byte)ale.first & 1) != 0)) &&
           (itemFeature[1].field_2._M_allocated_capacity != 0)) {
          TVar5 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
          if (TVar5 != OBJECT_LIBRARY) {
            TVar5 = cmGeneratorTarget::GetType
                              ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
            if (TVar5 != INTERFACE_LIBRARY) goto LAB_00b448bb;
          }
          pvVar10 = std::
                    vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    ::operator[](&this->EntryList,(size_type)local_68);
          psVar6 = &pvVar10->Feature;
          pcVar1 = this->CMakeInstance;
          local_260 = psVar6;
          TVar5 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
          local_298._16_8_ = "INTERFACE";
          if (TVar5 == OBJECT_LIBRARY) {
            local_298._16_8_ = "OBJECT";
          }
          cmStrCat<char_const(&)[14],std::__cxx11::string_const&,char_const(&)[50],cm::static_string_view_const&,std::__cxx11::string_const&,char_const(&)[32],char_const*,char_const(&)[11],std::__cxx11::string&,char_const(&)[3]>
                    ((string *)(local_298 + 0x18),(char (*) [14])"The feature \'",psVar6,
                     (char (*) [50])"\', specified as part of a generator-expression \'$",
                     (static_string_view *)&(anonymous_namespace)::LG_BEGIN,psVar6,
                     (char (*) [32])">\', will not be applied to the ",(char **)(local_298 + 0x10),
                     (char (*) [11])" library \'",itemFeature,(char (*) [3])0x11298d6);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_298);
          cmake::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)(local_298 + 0x18),
                              (cmListFileBacktrace *)local_298);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_298);
          std::__cxx11::string::~string((string *)(local_298 + 0x18));
        }
LAB_00b448bb:
        if (((byte)ale.first & 1) != 0) {
          bVar2 = std::operator!=(groupFeature_1,&cmLinkItem::DEFAULT_abi_cxx11_);
          if ((bVar2) && (itemFeature[1].field_2._M_allocated_capacity != 0)) {
            TVar5 = cmGeneratorTarget::GetType
                              ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
            if (TVar5 != OBJECT_LIBRARY) {
              TVar5 = cmGeneratorTarget::GetType
                                ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
              if (TVar5 != INTERFACE_LIBRARY) goto LAB_00b44a87;
            }
            psVar6 = groupFeature_1;
            pcVar1 = this->CMakeInstance;
            TVar5 = cmGeneratorTarget::GetType
                              ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
            local_2c0 = (cmLocalGenerator *)0x1157295;
            if (TVar5 == OBJECT_LIBRARY) {
              local_2c0 = (cmLocalGenerator *)0x114935d;
            }
            cmStrCat<char_const(&)[14],std::__cxx11::string_const&,char_const(&)[64],std::__cxx11::string_const&,char_const(&)[32],char_const*,char_const(&)[11],std::__cxx11::string&,char_const(&)[3]>
                      (&local_2b8,(char (*) [14])"The feature \'",psVar6,
                       (char (*) [64])
                       "\', specified as part of a generator-expression \'$<LINK_LIBRARY:",psVar6,
                       (char (*) [32])">\', will not be applied to the ",(char **)&local_2c0,
                       (char (*) [11])" library \'",itemFeature,(char (*) [3])0x11298d6);
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_2d0);
            cmake::IssueMessage(pcVar1,AUTHOR_WARNING,&local_2b8,(cmListFileBacktrace *)local_2d0);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2d0);
            std::__cxx11::string::~string((string *)&local_2b8);
          }
LAB_00b44a87:
          std::__cxx11::string::operator=
                    ((string *)&itemFeature[2]._M_string_length,(string *)groupFeature_1);
        }
        bVar2 = true;
        if (itemFeature[1].field_2._M_allocated_capacity != 0) {
          TVar5 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
          bVar2 = false;
          if (TVar5 != OBJECT_LIBRARY) {
            TVar5 = cmGeneratorTarget::GetType
                              ((cmGeneratorTarget *)itemFeature[1].field_2._M_allocated_capacity);
            bVar2 = TVar5 != INTERFACE_LIBRARY;
          }
        }
        if (bVar2) {
          if ((groupIndex._15_1_ & 1) != 0) {
            pvVar10 = std::
                      vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ::operator[](&this->EntryList,(size_type)local_68);
            __end4 = std::
                     map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     ::begin(&this->GroupItems);
            g = (pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 *)std::
                   map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::end(&this->GroupItems);
            while( true ) {
              bVar2 = std::operator!=(&__end4,(_Self *)&g);
              if (!bVar2) break;
              groupFeature_2 =
                   (string *)
                   std::
                   _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator*(&__end4);
              pvVar11 = std::
                        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ::operator[](&this->EntryList,*(size_type *)groupFeature_2);
              local_308 = (_Base_ptr)&pvVar11->Feature;
              _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_308,&pvVar10->Feature);
              if (!_Var3) {
                local_318._M_current =
                     (unsigned_long *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                &groupFeature_2->_M_string_length);
                local_320 = (unsigned_long *)
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       &groupFeature_2->_M_string_length);
                local_310 = std::
                            find<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                                      (local_318,
                                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                        )local_320,(unsigned_long *)&local_190);
                local_328._M_current =
                     (unsigned_long *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                &groupFeature_2->_M_string_length);
                bVar2 = __gnu_cxx::operator!=(&local_310,&local_328);
                if (bVar2) {
                  pcVar1 = this->CMakeInstance;
                  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
                  local_360[0x17] = 0x27;
                  local_360[0x16] = 0x27;
                  cmStrCat<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[26],std::__cxx11::string&,char_const(&)[38],std::__cxx11::string_const&,char,char_const(&)[42],std::__cxx11::string_const&,char,char_const(&)[24]>
                            ((string *)(local_360 + 0x18),
                             (char (*) [28])"Impossible to link target \'",psVar6,
                             (char (*) [26])"\' because the link item \'",itemFeature,
                             (char (*) [38])"\', specified with the group feature \'",
                             &pvVar10->Feature,local_360 + 0x17,
                             (char (*) [42])", has already occurred with the feature \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_308,local_360 + 0x16,(char (*) [24])", which is not allowed.");
                  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_360);
                  cmake::IssueMessage(pcVar1,FATAL_ERROR,(string *)(local_360 + 0x18),
                                      (cmListFileBacktrace *)local_360);
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_360);
                  std::__cxx11::string::~string((string *)(local_360 + 0x18));
                }
              }
              std::
              _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator++(&__end4);
            }
          }
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&itemFeature[2]._M_string_length,groupFeature_1);
          if (bVar2) {
            pcVar1 = this->CMakeInstance;
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
            psVar6 = itemFeature;
            _Var3 = std::operator==(groupFeature_1,&cmLinkItem::DEFAULT_abi_cxx11_);
            local_3a2 = 0;
            if (_Var3) {
              std::allocator<char>::allocator();
              local_3a2 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3a0,"without any feature or \'DEFAULT\' feature",
                         &local_3a1);
            }
            else {
              local_3a3 = '\'';
              cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char>
                        (&local_3a0,(char (*) [19])0x1170c62,groupFeature_1,&local_3a3);
            }
            _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&itemFeature[2]._M_string_length,
                                    &cmLinkItem::DEFAULT_abi_cxx11_);
            local_3ca = 0;
            if (_Var3) {
              std::allocator<char>::allocator();
              local_3ca = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3c8,"without any feature or \'DEFAULT\' feature",
                         &local_3c9);
            }
            else {
              local_3cb = '\'';
              cmStrCat<char_const(&)[19],std::__cxx11::string&,char>
                        (&local_3c8,(char (*) [19])0x1170c62,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &itemFeature[2]._M_string_length,&local_3cb);
            }
            cmStrCat<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[26],std::__cxx11::string&,char_const(&)[14],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[24]>
                      (&local_380,(char (*) [28])"Impossible to link target \'",psVar7,
                       (char (*) [26])"\' because the link item \'",psVar6,
                       (char (*) [14])"\', specified ",&local_3a0,
                       (char (*) [24])", has already occurred ",&local_3c8,
                       (char (*) [24])", which is not allowed.");
            cmGeneratorTarget::GetBacktrace
                      ((cmGeneratorTarget *)
                       &indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_380,
                                (cmListFileBacktrace *)
                                &indexes.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            cmListFileBacktrace::~cmListFileBacktrace
                      ((cmListFileBacktrace *)
                       &indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string((string *)&local_380);
            std::__cxx11::string::~string((string *)&local_3c8);
            if ((local_3ca & 1) != 0) {
              std::allocator<char>::~allocator(&local_3c9);
            }
            std::__cxx11::string::~string((string *)&local_3a0);
            if ((local_3a2 & 1) != 0) {
              std::allocator<char>::~allocator(&local_3a1);
            }
          }
        }
        if ((groupIndex._15_1_ & 1) == 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8);
          bVar2 = false;
          __end3 = std::
                   map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::begin(&this->GroupItems);
          group = (pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)std::
                     map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     ::end(&this->GroupItems);
          while( true ) {
            bVar4 = std::operator!=(&__end3,(_Self *)&group);
            if (!bVar4) break;
            __x = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator*(&__end3);
            __end4_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                 (&__x->second);
            index = (unsigned_long)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&__x->second);
            while( true ) {
              bVar4 = __gnu_cxx::operator!=
                                (&__end4_1,
                                 (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)&index);
              if (!bVar4) break;
              puVar12 = __gnu_cxx::
                        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator*(&__end4_1);
              psVar6 = itemFeature;
              pvVar10 = std::
                        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ::operator[](&this->EntryList,*puVar12);
              _Var3 = std::operator==(psVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)pvVar10);
              if (_Var3) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8,
                           &__x->first);
                bVar2 = true;
                break;
              }
              __gnu_cxx::
              __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator++(&__end4_1);
            }
            std::
            _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::operator++(&__end3);
          }
          if (!bVar2) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8,
                       (value_type_conflict1 *)&local_190);
          }
          __end3_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8);
          index_1 = (unsigned_long)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&__end3_1,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&index_1);
            if (!bVar2) break;
            puVar13 = __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator*(&__end3_1);
            local_460 = *puVar13;
            if (depender_index == 0xffffffffffffffff) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        (&this->OriginalEntries,&local_460);
            }
            else {
              pvVar14 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                        std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                                  (&(this->EntryConstraintGraph).
                                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                                   depender_index);
              local_461 = false;
              local_462 = false;
              __range4_2 = (map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
                            *)0x0;
              _Stack_470._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range4_2);
              std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
              emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace>
                        (pvVar14,&local_460,&local_461,&local_462,(cmListFileBacktrace *)&__range4_2
                        );
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range4_2);
            }
            __end4_2 = std::
                       map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
                       ::begin((map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
                                *)local_50);
            dependSet = (pair<const_unsigned_long,_cmComputeLinkDepends::DependSet> *)
                        std::
                        map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
                        ::end((map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
                               *)local_50);
            while( true ) {
              bVar2 = std::operator!=(&__end4_2,(_Self *)&dependSet);
              if (!bVar2) break;
              ppVar15 = std::
                        _Rb_tree_iterator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>
                        ::operator*(&__end4_2);
              pvVar10 = std::
                        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ::operator[](&this->EntryList,local_460);
              if (pvVar10->Target == (cmGeneratorTarget *)0x0) {
                pvVar10 = std::
                          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                          ::operator[](&this->EntryList,local_460);
                if (pvVar10->Kind != Flag) {
                  pvVar10 = std::
                            vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                            ::operator[](&this->EntryList,local_460);
                  if ((pvVar10->Kind != Group) && (local_190 != (LinkEntry *)ppVar15->first)) {
                    std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    insert(&(ppVar15->second).
                            super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           ,&local_460);
                  }
                }
              }
              std::
              _Rb_tree_iterator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>::
              operator++(&__end4_2);
            }
            pvVar16 = std::
                      vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                      ::operator[](&this->InferredDependSets,local_460);
            if ((pvVar16->Initialized & 1U) != 0) {
              std::
              map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
              ::operator[]((map<unsigned_long,_cmComputeLinkDepends::DependSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::DependSet>_>_>
                            *)local_50,&local_460);
            }
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&__end3_1);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8);
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1,
                     (value_type_conflict1 *)&local_190);
        }
      }
    }
LAB_00b4556a:
    __gnu_cxx::
    __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
    operator++(&__end0);
  } while( true );
}

Assistant:

void cmComputeLinkDepends::AddLinkEntries(size_t depender_index,
                                          std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<size_t, DependSet> dependSets;

  bool inGroup = false;
  std::pair<size_t, bool> groupIndex{
    cmComputeComponentGraph::INVALID_COMPONENT, false
  };
  std::vector<size_t> groupItems;

  // Loop over the libraries linked directly by the depender.
  for (T const& l : libs) {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = l;
    if (item.AsStr() == this->Target->GetName() || item.AsStr().empty()) {
      continue;
    }

    // emit a warning if an undefined feature is used as part of
    // an imported target
    if (item.Feature != LinkEntry::DEFAULT &&
        depender_index != cmComputeComponentGraph::INVALID_COMPONENT) {
      const auto& depender = this->EntryList[depender_index];
      if (depender.Target != nullptr && depender.Target->IsImported() &&
          !IsFeatureSupported(this->Makefile, this->LinkLanguage,
                              item.Feature)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_ERROR,
          cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                   "' uses the generator-expression '$<LINK_LIBRARY>' with "
                   "the feature '",
                   item.Feature,
                   "', which is undefined or unsupported.\nDid you miss to "
                   "define it by setting variables \"CMAKE_",
                   this->LinkLanguage, "_LINK_LIBRARY_USING_", item.Feature,
                   "\" and \"CMAKE_", this->LinkLanguage,
                   "_LINK_LIBRARY_USING_", item.Feature, "_SUPPORTED\"?"),
          this->Target->GetBacktrace());
      }
    }

    if (cmHasPrefix(item.AsStr(), LG_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      groupIndex = this->AddLinkEntry(item);
      if (groupIndex.second) {
        LinkEntry& entry = this->EntryList[groupIndex.first];
        entry.Feature = ExtractGroupFeature(item.AsStr());
      }
      inGroup = true;
      if (depender_index != cmComputeComponentGraph::INVALID_COMPONENT) {
        this->EntryConstraintGraph[depender_index].emplace_back(
          groupIndex.first, false, false, cmListFileBacktrace());
      } else {
        // This is a direct dependency of the target being linked.
        this->OriginalEntries.push_back(groupIndex.first);
      }
      continue;
    }

    size_t dependee_index;

    if (cmHasPrefix(item.AsStr(), LG_END) && cmHasSuffix(item.AsStr(), '>')) {
      dependee_index = groupIndex.first;
      if (groupIndex.second) {
        this->GroupItems.emplace(groupIndex.first, groupItems);
      }
      inGroup = false;
      groupIndex = std::make_pair(-1, false);
      groupItems.clear();
      continue;
    }

    if (depender_index != cmComputeComponentGraph::INVALID_COMPONENT &&
        inGroup) {
      const auto& depender = this->EntryList[depender_index];
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      if (depender.Target != nullptr && depender.Target->IsImported() &&
          !IsGroupFeatureSupported(this->Makefile, this->LinkLanguage,
                                   groupFeature)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_ERROR,
          cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                   "' uses the generator-expression '$<LINK_GROUP>' with "
                   "the feature '",
                   groupFeature,
                   "', which is undefined or unsupported.\nDid you miss to "
                   "define it by setting variables \"CMAKE_",
                   this->LinkLanguage, "_LINK_GROUP_USING_", groupFeature,
                   "\" and \"CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_",
                   groupFeature, "_SUPPORTED\"?"),
          this->Target->GetBacktrace());
      }
    }

    // Add a link entry for this item.
    auto ale = this->AddLinkEntry(item, groupIndex.first);
    dependee_index = ale.first;
    LinkEntry& entry = this->EntryList[dependee_index];
    auto const& itemFeature =
      this->GetCurrentFeature(entry.Item.Value, item.Feature);
    if (inGroup && ale.second && entry.Target != nullptr &&
        (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY ||
         entry.Target->GetType() ==
           cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      this->CMakeInstance->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          "The feature '", groupFeature,
          "', specified as part of a generator-expression "
          "'$",
          LG_BEGIN, groupFeature, ">', will not be applied to the ",
          (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY
             ? "OBJECT"
             : "INTERFACE"),
          " library '", entry.Item.Value, "'."),
        this->Target->GetBacktrace());
    }
    if (ale.second) {
      // current item not yet defined
      if (itemFeature != LinkEntry::DEFAULT && entry.Target != nullptr &&
          (entry.Target->GetType() ==
             cmStateEnums::TargetType::OBJECT_LIBRARY ||
           entry.Target->GetType() ==
             cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("The feature '", itemFeature,
                   "', specified as part of a generator-expression "
                   "'$<LINK_LIBRARY:",
                   itemFeature, ">', will not be applied to the ",
                   (entry.Target->GetType() ==
                        cmStateEnums::TargetType::OBJECT_LIBRARY
                      ? "OBJECT"
                      : "INTERFACE"),
                   " library '", entry.Item.Value, "'."),
          this->Target->GetBacktrace());
      }
      entry.Feature = itemFeature;
    }

    bool supportedItem = entry.Target == nullptr ||
      (entry.Target->GetType() != cmStateEnums::TargetType::OBJECT_LIBRARY &&
       entry.Target->GetType() != cmStateEnums::TargetType::INTERFACE_LIBRARY);

    if (supportedItem) {
      if (inGroup) {
        const auto& currentFeature = this->EntryList[groupIndex.first].Feature;
        for (const auto& g : this->GroupItems) {
          const auto& groupFeature = this->EntryList[g.first].Feature;
          if (groupFeature == currentFeature) {
            continue;
          }
          if (std::find(g.second.cbegin(), g.second.cend(), dependee_index) !=
              g.second.cend()) {
            this->CMakeInstance->IssueMessage(
              MessageType::FATAL_ERROR,
              cmStrCat("Impossible to link target '", this->Target->GetName(),
                       "' because the link item '", entry.Item.Value,
                       "', specified with the group feature '", currentFeature,
                       '\'', ", has already occurred with the feature '",
                       groupFeature, '\'', ", which is not allowed."),
              this->Target->GetBacktrace());
            continue;
          }
        }
      }
      if (entry.Feature != itemFeature) {
        // incompatibles features occurred
        this->CMakeInstance->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Impossible to link target '", this->Target->GetName(),
                   "' because the link item '", entry.Item.Value,
                   "', specified ",
                   (itemFeature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", itemFeature, '\'')),
                   ", has already occurred ",
                   (entry.Feature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", entry.Feature, '\'')),
                   ", which is not allowed."),
          this->Target->GetBacktrace());
      }
    }

    if (inGroup) {
      // store item index for dependencies handling
      groupItems.push_back(dependee_index);
    } else {
      std::vector<size_t> indexes;
      bool entryHandled = false;
      // search any occurrence of the library in already defined groups
      for (const auto& group : this->GroupItems) {
        for (auto index : group.second) {
          if (entry.Item.Value == this->EntryList[index].Item.Value) {
            indexes.push_back(group.first);
            entryHandled = true;
            break;
          }
        }
      }
      if (!entryHandled) {
        indexes.push_back(dependee_index);
      }

      for (auto index : indexes) {
        // The dependee must come after the depender.
        if (depender_index != cmComputeComponentGraph::INVALID_COMPONENT) {
          this->EntryConstraintGraph[depender_index].emplace_back(
            index, false, false, cmListFileBacktrace());
        } else {
          // This is a direct dependency of the target being linked.
          this->OriginalEntries.push_back(index);
        }

        // Update the inferred dependencies for earlier items.
        for (auto& dependSet : dependSets) {
          // Add this item to the inferred dependencies of other items.
          // Target items are never inferred dependees because unknown
          // items are outside libraries that should not be depending on
          // targets.
          if (!this->EntryList[index].Target &&
              this->EntryList[index].Kind != LinkEntry::Flag &&
              this->EntryList[index].Kind != LinkEntry::Group &&
              dependee_index != dependSet.first) {
            dependSet.second.insert(index);
          }
        }

        // If this item needs to have dependencies inferred, do so.
        if (this->InferredDependSets[index].Initialized) {
          // Make sure an entry exists to hold the set for the item.
          dependSets[index];
        }
      }
    }
  }

  // Store the inferred dependency sets discovered for this list.
  for (auto const& dependSet : dependSets) {
    this->InferredDependSets[dependSet.first].push_back(dependSet.second);
  }
}